

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O2

bool __thiscall
crnlib::crn_comp::pack_alpha_endpoints
          (crn_comp *this,vector<unsigned_char> *packed_data,vector<unsigned_short> *remapping)

{
  uint *puVar1;
  unsigned_short *puVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  uint j;
  long lVar8;
  uint i_1;
  uint prev [2];
  vector<unsigned_int> residual_syms;
  symbol_histogram hist;
  vector<unsigned_int> remapped_endpoints;
  static_huffman_data_model residual_dm;
  uint cur [2];
  uchar *local_80;
  uint local_78;
  uint uStack_74;
  
  vector<unsigned_int>::vector(&remapped_endpoints,(this->m_alpha_endpoints).m_size);
  puVar1 = (this->m_alpha_endpoints).m_p;
  puVar2 = remapping->m_p;
  for (uVar6 = 0; uVar6 < (this->m_alpha_endpoints).m_size; uVar6 = uVar6 + 1) {
    remapped_endpoints.m_p[puVar2[uVar6]] = puVar1[uVar6];
  }
  vector<unsigned_int>::vector(&hist.m_hist,0);
  symbol_histogram::resize(&hist,0x100);
  residual_syms.m_p = (uint *)0x0;
  residual_syms.m_size = 0;
  residual_syms.m_capacity = 0;
  vector<unsigned_int>::reserve(&residual_syms,(this->m_alpha_endpoints).m_size * 6);
  prev[0] = 0;
  prev[1] = 0;
  for (uVar6 = 0; uVar6 < (this->m_alpha_endpoints).m_size; uVar6 = uVar6 + 1) {
    uVar4 = remapped_endpoints.m_p[uVar6];
    uVar3 = dxt5_block::unpack_endpoint(uVar4,0);
    cur[0] = uVar3;
    uVar4 = dxt5_block::unpack_endpoint(uVar4,1);
    cur[1] = uVar4;
    for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
      residual_dm.m_total_syms = cur[lVar8] - prev[lVar8] & 0xff;
      hist.m_hist.m_p[residual_dm.m_total_syms] = hist.m_hist.m_p[residual_dm.m_total_syms] + 1;
      vector<unsigned_int>::push_back(&residual_syms,&residual_dm.m_total_syms);
    }
    prev[1] = uVar4;
    prev[0] = uVar3;
  }
  static_huffman_data_model::static_huffman_data_model(&residual_dm);
  symbol_codec::symbol_codec((symbol_codec *)cur);
  symbol_codec::start_encoding((symbol_codec *)cur,0x100000);
  iVar5 = static_huffman_data_model::init(&residual_dm,(EVP_PKEY_CTX *)0x1);
  if ((char)iVar5 != '\0') {
    uVar4 = symbol_codec::encode_transmit_static_huffman_data_model
                      ((symbol_codec *)cur,&residual_dm,false,(static_huffman_data_model *)0x0);
    if (uVar4 != 0) {
      for (uVar6 = 0; uVar6 < (residual_syms._8_8_ & 0xffffffff); uVar6 = uVar6 + 1) {
        symbol_codec::encode((symbol_codec *)cur,residual_syms.m_p[uVar6],&residual_dm);
      }
      symbol_codec::stop_encoding((symbol_codec *)cur,false);
      packed_data->m_p = local_80;
      packed_data->m_size = local_78;
      packed_data->m_capacity = uStack_74;
      bVar7 = true;
      goto LAB_00150eee;
    }
  }
  bVar7 = false;
LAB_00150eee:
  symbol_codec::~symbol_codec((symbol_codec *)cur);
  static_huffman_data_model::~static_huffman_data_model(&residual_dm);
  vector<unsigned_int>::~vector(&residual_syms);
  vector<unsigned_int>::~vector(&hist.m_hist);
  vector<unsigned_int>::~vector(&remapped_endpoints);
  return bVar7;
}

Assistant:

bool crn_comp::pack_alpha_endpoints(crnlib::vector<uint8>& packed_data, const crnlib::vector<uint16>& remapping)
    {
        crnlib::vector<uint> remapped_endpoints(m_alpha_endpoints.size());

        for (uint i = 0; i < m_alpha_endpoints.size(); i++)
        {
            remapped_endpoints[remapping[i]] = m_alpha_endpoints[i];
        }

        symbol_histogram hist;
        hist.resize(256);

        crnlib::vector<uint> residual_syms;
        residual_syms.reserve(m_alpha_endpoints.size() * 2 * 3);

        uint prev[2];
        utils::zero_object(prev);

        int total_residuals = 0;

        for (uint endpoint_index = 0; endpoint_index < m_alpha_endpoints.size(); endpoint_index++)
        {
            const uint endpoint = remapped_endpoints[endpoint_index];

            uint cur[2];
            cur[0] = dxt5_block::unpack_endpoint(endpoint, 0);
            cur[1] = dxt5_block::unpack_endpoint(endpoint, 1);

            for (uint j = 0; j < 2; j++)
            {
                int delta = cur[j] - prev[j];
                total_residuals += delta * delta;

                int sym = delta & 255;

                hist.inc_freq(sym);

                residual_syms.push_back(sym);
            }

            prev[0] = cur[0];
            prev[1] = cur[1];
        }

        static_huffman_data_model residual_dm;

        symbol_codec codec;
        codec.start_encoding(1024 * 1024);

        // Transmit residuals
        if (!residual_dm.init(true, hist, 15))
        {
            return false;
        }

        if (!codec.encode_transmit_static_huffman_data_model(residual_dm, false))
        {
            return false;
        }

        for (uint i = 0; i < residual_syms.size(); i++)
        {
            const uint sym = residual_syms[i];
            codec.encode(sym, residual_dm);
        }

        codec.stop_encoding(false);

        packed_data.swap(codec.get_encoding_buf());

        return true;
    }